

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O2

void __thiscall
SortedList<MessageQueue::ListEntry>::Insert
          (SortedList<MessageQueue::ListEntry> *this,ListEntry *data)

{
  MessageBase *pMVar1;
  undefined4 uVar2;
  DListNode<MessageQueue::ListEntry> *newNode;
  DListNode<MessageQueue::ListEntry> *node;
  DListNode<MessageQueue::ListEntry> *pDVar3;
  
  newNode = (DListNode<MessageQueue::ListEntry> *)operator_new(0x20);
  uVar2 = *(undefined4 *)&data->field_0x4;
  pMVar1 = data->message;
  (newNode->data).time = data->time;
  *(undefined4 *)&(newNode->data).field_0x4 = uVar2;
  (newNode->data).message = pMVar1;
  newNode->prev = (DListNode<MessageQueue::ListEntry> *)0x0;
  newNode->next = (DListNode<MessageQueue::ListEntry> *)0x0;
  node = (DListNode<MessageQueue::ListEntry> *)0x0;
  for (pDVar3 = this->head;
      (pDVar3 != (DListNode<MessageQueue::ListEntry> *)0x0 && ((pDVar3->data).time <= data->time));
      pDVar3 = pDVar3->next) {
    node = pDVar3;
  }
  InsertAfter(this,newNode,node);
  return;
}

Assistant:

void Insert(const T& data)
    {
        DListNode<T>* curr = head;
        DListNode<T>* node = new DListNode<T>(data);
        DListNode<T>* prev = nullptr; 

        // Now, if we have to insert, we have to insert *after* some node
        while (curr != nullptr)
        {
            if (T::LessThan(data, curr->data))
            {
                break;
            }
            prev = curr;
            curr = curr->next;
        }

        InsertAfter(node, prev);
    }